

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdInitializeMultisigScriptSig(void *handle,void **multisig_handle)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  string *in_RDI;
  CfdException *except;
  exception *std_except;
  int result;
  string *in_stack_ffffffffffffff40;
  allocator *paVar3;
  CfdException *this;
  allocator local_91;
  string local_90 [38];
  undefined1 local_6a;
  undefined1 local_69 [33];
  CfdSourceLocation local_48;
  undefined4 local_1c;
  
  local_1c = 0xffffffff;
  cfd::Initialize();
  if (in_RSI == (undefined8 *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x113;
    local_48.funcname = "CfdInitializeMultisigScriptSig";
    cfd::core::logger::warn<>(&local_48,"multisig sign handle is null.");
    local_6a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),"Failed to parameter. multisig sign handle is null.",
               (allocator *)this);
    cfd::core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_ffffffffffffff40);
    local_6a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar3 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"MultiScriptSig",paVar3);
  pvVar2 = cfd::capi::AllocBuffer(in_RDI,(uint32_t)((ulong)in_RSI >> 0x20));
  *in_RSI = pvVar2;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return 0;
}

Assistant:

int CfdInitializeMultisigScriptSig(void* handle, void** multisig_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (multisig_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig sign handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig sign handle is null.");
    }

    *multisig_handle = AllocBuffer(
        kPrefixMultisigScriptSig, sizeof(CfdCapiMultisigScriptSigData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}